

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O0

void HU_GetPlayerWidths(int *maxnamewidth,int *maxscorewidth,int *maxiconheight)

{
  FFont *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *str;
  FTexture *this_00;
  int height;
  FTexture *pic;
  int width;
  int i;
  int *maxiconheight_local;
  int *maxscorewidth_local;
  int *maxnamewidth_local;
  
  iVar2 = FFont::StringWidth(SmallFont,"Name");
  *maxnamewidth = iVar2;
  *maxscorewidth = 0;
  *maxiconheight = 0;
  for (pic._4_4_ = 0; this = SmallFont, pic._4_4_ < 8; pic._4_4_ = pic._4_4_ + 1) {
    if ((playeringame[pic._4_4_] & 1U) != 0) {
      str = userinfo_t::GetName((userinfo_t *)((long)pic._4_4_ * 0x2a0 + 0xd63498));
      iVar2 = FFont::StringWidth(this,str);
      if (*maxnamewidth < iVar2) {
        *maxnamewidth = iVar2;
      }
      bVar1 = FTextureID::isValid((FTextureID *)((&players)[(long)pic._4_4_ * 0x54] + 0x508));
      if (bVar1) {
        this_00 = FTextureManager::operator[]
                            (&TexMan,(FTextureID)
                                     *(int *)((&players)[(long)pic._4_4_ * 0x54] + 0x508));
        iVar2 = FTexture::GetScaledWidth(this_00);
        iVar3 = FTexture::GetScaledLeftOffset(this_00);
        iVar2 = (iVar2 - iVar3) + 2;
        if (*maxscorewidth < iVar2) {
          *maxscorewidth = iVar2;
        }
        iVar2 = FTexture::GetScaledHeight(this_00);
        iVar3 = FTexture::GetScaledTopOffset(this_00);
        if (*maxiconheight < iVar2 - iVar3) {
          *maxiconheight = iVar2 - iVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void HU_GetPlayerWidths(int &maxnamewidth, int &maxscorewidth, int &maxiconheight)
{
	maxnamewidth = SmallFont->StringWidth("Name");
	maxscorewidth = 0;
	maxiconheight = 0;

	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{
			int width = SmallFont->StringWidth(players[i].userinfo.GetName());
			if (width > maxnamewidth)
			{
				maxnamewidth = width;
			}
			if (players[i].mo->ScoreIcon.isValid())
			{
				FTexture *pic = TexMan[players[i].mo->ScoreIcon];
				width = pic->GetScaledWidth() - pic->GetScaledLeftOffset() + 2;
				if (width > maxscorewidth)
				{
					maxscorewidth = width;
				}
				// The icon's top offset does not count toward its height, because
				// zdoom.pk3's standard Hexen class icons are designed that way.
				int height = pic->GetScaledHeight() - pic->GetScaledTopOffset();
				if (height > maxiconheight)
				{
					maxiconheight = height;
				}
			}
		}
	}
}